

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O0

_Bool load_block(ang_file *f,blockheader *b,loader_t loader)

{
  int iVar1;
  loader_t loader_local;
  blockheader *b_local;
  ang_file *f_local;
  
  buffer = (uint8_t *)mem_alloc((ulong)b->size);
  buffer_pos = 0;
  buffer_check = 0;
  buffer_size = file_read(f,(char *)buffer,(ulong)b->size);
  if ((buffer_size == b->size) && (iVar1 = (*loader)(), iVar1 == 0)) {
    mem_free(buffer);
    return true;
  }
  mem_free(buffer);
  return false;
}

Assistant:

static bool load_block(ang_file *f, struct blockheader *b, loader_t loader)
{
	/* Allocate space for the buffer */
	buffer = mem_alloc(b->size);
	buffer_pos = 0;
	buffer_check = 0;

	buffer_size = file_read(f, (char *) buffer, b->size);
	if (buffer_size != b->size ||
			loader() != 0) {
		mem_free(buffer);
		return false;
	}

	mem_free(buffer);
	return true;
}